

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

int kget_int32(kstring_t *k,size_t *pos,int32_t *val_p)

{
  bool bVar1;
  ulong local_38;
  size_t p;
  int32_t val;
  int sign;
  int32_t *val_p_local;
  size_t *pos_local;
  kstring_t *k_local;
  
  p._4_4_ = 1;
  p._0_4_ = 0;
  local_38 = *pos;
  while( true ) {
    bVar1 = false;
    if ((local_38 < k->l) && (bVar1 = true, k->s[local_38] != ' ')) {
      bVar1 = k->s[local_38] == '\t';
    }
    if (!bVar1) break;
    local_38 = local_38 + 1;
  }
  if ((local_38 < k->l) && (k->s[local_38] == '-')) {
    p._4_4_ = -1;
    local_38 = local_38 + 1;
  }
  if (((local_38 < k->l) && ('/' < k->s[local_38])) && (k->s[local_38] < ':')) {
    while( true ) {
      bVar1 = false;
      if ((local_38 < k->l) && (bVar1 = false, '/' < k->s[local_38])) {
        bVar1 = k->s[local_38] < ':';
      }
      if (!bVar1) break;
      p._0_4_ = (int)p * 10 + (int)k->s[local_38] + -0x30;
      local_38 = local_38 + 1;
    }
    *pos = local_38;
    *val_p = p._4_4_ * (int)p;
    k_local._4_4_ = 0;
  }
  else {
    k_local._4_4_ = -1;
  }
  return k_local._4_4_;
}

Assistant:

static int kget_int32(kstring_t *k, size_t *pos, int32_t *val_p) {
    int sign = 1;
    int32_t val = 0;
    size_t p = *pos;

    while (p < k->l && (k->s[p] == ' ' || k->s[p] == '\t'))
	   p++;

    if (p < k->l && k->s[p] == '-')
	sign = -1, p++;

    if (p >= k->l || !(k->s[p] >= '0' && k->s[p] <= '9'))
	return -1;

    while (p < k->l && k->s[p] >= '0' && k->s[p] <= '9')
	val = val*10 + k->s[p++]-'0';
    
    *pos = p;
    *val_p = sign*val;

    return 0;
}